

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

Name __thiscall
wasm::Asyncify::createSecondaryMemory(Asyncify *this,Module *module,Address secondaryMemorySize)

{
  IString IVar1;
  Name name_00;
  Type local_70;
  address64_t local_68;
  Address local_60;
  char *local_58;
  Address AStack_50;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_48;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> secondaryMemory;
  Module *module_local;
  Asyncify *this_local;
  Address secondaryMemorySize_local;
  Name name;
  
  wasm::Name::Name((Name *)&secondaryMemory,"asyncify_memory");
  IVar1.str = (string_view)Names::getValidMemoryName(module,_secondaryMemory);
  secondaryMemorySize_local.addr = IVar1.str._M_len;
  name.super_IString.str._M_len = (size_t)IVar1.str._M_str;
  local_58 = (char *)secondaryMemorySize_local.addr;
  AStack_50.addr = name.super_IString.str._M_len;
  local_68 = secondaryMemorySize.addr;
  local_60.addr = secondaryMemorySize.addr;
  wasm::Type::Type(&local_70,i32);
  name_00.super_IString.str._M_str = local_58;
  name_00.super_IString.str._M_len = (size_t)&local_48;
  Builder::makeMemory(name_00,AStack_50,local_60,SUB81(local_68,0),(Type)0x0);
  Module::addMemory(module,&local_48);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_48);
  return (IString)(IString)IVar1.str;
}

Assistant:

Name createSecondaryMemory(Module* module, Address secondaryMemorySize) {
    Name name = Names::getValidMemoryName(*module, "asyncify_memory");
    auto secondaryMemory =
      Builder::makeMemory(name, secondaryMemorySize, secondaryMemorySize);
    module->addMemory(std::move(secondaryMemory));
    return name;
  }